

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawList *this;
  ImGuiViewportP *this_00;
  ImDrawCmd *pIVar1;
  ImRect IVar2;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_70;
  ImRect local_68;
  ImDrawCmd local_58;
  
  if (0xffffff < col) {
    this_00 = (ImGuiViewportP *)GetMainViewport();
    IVar2 = ImGuiViewportP::GetMainRect(this_00);
    this = window->RootWindow->DrawList;
    local_68 = IVar2;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    local_58.ClipRect.y = IVar2.Min.y + -1.0;
    local_58.ClipRect.x = IVar2.Min.x + -1.0;
    local_70.y = IVar2.Max.y + 1.0;
    local_70.x = IVar2.Max.x + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_58,&local_70,false);
    ImDrawList::AddRectFilled(this,&local_68.Min,&local_68.Max,col,0.0,0);
    pIVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
    local_58.ClipRect.x = (pIVar1->ClipRect).x;
    local_58.ClipRect.y = (pIVar1->ClipRect).y;
    local_58.ClipRect.z = (pIVar1->ClipRect).z;
    local_58.ClipRect.w = (pIVar1->ClipRect).w;
    local_58.TextureId = pIVar1->TextureId;
    local_58.VtxOffset = pIVar1->VtxOffset;
    local_58.IdxOffset = pIVar1->IdxOffset;
    local_58.ElemCount = pIVar1->ElemCount;
    local_58._36_4_ = *(undefined4 *)&pIVar1->field_0x24;
    local_58.UserCallback = pIVar1->UserCallback;
    local_58.UserCallbackData = pIVar1->UserCallbackData;
    if (local_58.ElemCount != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x129f,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
    ImVector<ImDrawCmd>::push_front(&this->CmdBuffer,&local_58);
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}